

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

size_t __thiscall efsw::String::find_first_not_of(String *this,StringBaseType c,size_t pos)

{
  ulong uVar1;
  
  uVar1 = (this->mString)._M_string_length;
  if (pos < uVar1) {
    do {
      if ((this->mString)._M_dataplus._M_p[pos] != c) {
        return pos;
      }
      pos = pos + 1;
    } while (uVar1 != pos);
  }
  return 0xffffffffffffffff;
}

Assistant:

std::size_t String::find_first_not_of( StringBaseType c, std::size_t pos ) const {
	return mString.find_first_not_of( c, pos );
}